

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O1

int main(int argc,char **argv)

{
  double x;
  double dVar1;
  double dVar2;
  ALLEGRO_COLOR c1;
  ALLEGRO_COLOR c1_00;
  ALLEGRO_COLOR c1_01;
  ALLEGRO_COLOR c1_02;
  ALLEGRO_COLOR c2;
  ALLEGRO_COLOR c2_00;
  ALLEGRO_COLOR c2_01;
  ALLEGRO_COLOR c2_02;
  bool bVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int extraout_EAX;
  long lVar8;
  undefined8 uVar9;
  Camera *pCVar10;
  undefined8 uVar11;
  long lVar12;
  undefined8 *puVar13;
  int iVar14;
  Camera *pCVar15;
  char *pcVar16;
  int iVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double x_00;
  double x_01;
  double dVar23;
  double y;
  float fVar24;
  float fVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  float fVar30;
  Vector axis;
  Vector axis_00;
  Vector axis_01;
  Vector axis_02;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ALLEGRO_COLOR AVar33;
  ALLEGRO_COLOR AVar34;
  double pz;
  ALLEGRO_TRANSFORM projection_1;
  ALLEGRO_EVENT event;
  ALLEGRO_TRANSFORM projection;
  ulong uVar35;
  undefined8 in_stack_fffffffffffffdc0;
  double dVar36;
  double local_1c8;
  double dStack_1c0;
  undefined1 local_108 [72];
  int local_c0 [8];
  int local_a0;
  undefined8 local_90;
  uint local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (argc < 2) {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = argv[1];
  }
  cVar5 = al_install_system(0x5020700,atexit);
  if (cVar5 == '\0') {
    pcVar16 = "Could not init Allegro.\n";
  }
  else {
    al_init_font_addon();
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_set_new_display_option(0x11,1,2);
    al_set_new_display_option(0x12,8,2);
    al_set_new_display_option(0xf,0x10,2);
    al_set_new_display_flags(0x10);
    lVar8 = al_create_display(0x280,0x168);
    if (lVar8 != 0) {
      if (pcVar16 != (char *)0x0) {
        al_init_image_addon();
        ex.skybox = (ALLEGRO_BITMAP *)al_load_bitmap(pcVar16);
        if (ex.skybox == (ALLEGRO_BITMAP *)0x0) {
          printf("Failed loading skybox %s\n",pcVar16);
        }
        else {
          uVar6 = al_get_bitmap_width(ex.skybox);
          uVar7 = al_get_bitmap_height(ex.skybox);
          printf("Loaded skybox %s: %d x %d\n",pcVar16,(ulong)uVar6,(ulong)uVar7);
        }
      }
      uVar9 = al_create_timer(0x3f91111111111111);
      pCVar10 = (Camera *)al_create_event_queue();
      uVar11 = al_get_keyboard_event_source();
      al_register_event_source(pCVar10,uVar11);
      uVar11 = al_get_mouse_event_source();
      al_register_event_source(pCVar10,uVar11);
      uVar11 = al_get_display_event_source(lVar8);
      al_register_event_source(pCVar10,uVar11);
      uVar11 = al_get_timer_event_source(uVar9);
      al_register_event_source(pCVar10,uVar11);
      ex.camera.xaxis.x = 1.0;
      ex.camera.yaxis.y = 1.0;
      ex.camera.zaxis.z = 1.0;
      ex.camera.position.y = 2.0;
      ex.camera.vertical_field_of_view = 1.0471975511965976;
      ex.mouse_look_speed = 0.03;
      ex.movement_speed = 0.05;
      ex.controls_names[0] = "FPS";
      ex.controls_names[1] = "airplane";
      ex.controls_names[2] = "spaceship";
      ex.font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_start_timer(uVar9);
      bVar3 = false;
      do {
        pCVar15 = pCVar10;
        al_wait_for_event(pCVar10,local_c0);
        if (local_c0[0] < 0x16) {
          if (local_c0[0] < 0x14) {
            if (local_c0[0] == 10) {
              lVar12 = (long)local_a0;
              if (lVar12 == 0x3b) goto LAB_00102a50;
              if (local_a0 == 0x4b) {
                ex.controls = ex.controls + ((ex.controls + 1) / 3) * -3 + 1;
              }
              ex.key[lVar12] = 1;
              ex.keystate[lVar12] = 1;
            }
            else if (local_c0[0] == 0xc) {
              ex.keystate[local_a0] = 0;
            }
          }
          else if (local_c0[0] == 0x14) {
            ex.mouse_dx = ex.mouse_dx + (int)local_90;
            ex.mouse_dy = ex.mouse_dy + (int)((ulong)local_90 >> 0x20);
          }
          else if (local_c0[0] == 0x15) {
            ex.button[local_80] = 1;
          }
LAB_00102e8f:
          bVar4 = true;
          if (bVar3) {
            cVar5 = al_is_event_queue_empty(pCVar10);
            bVar3 = true;
            if (cVar5 != '\0') {
              puVar13 = (undefined8 *)al_get_current_projection_transform();
              local_78 = *puVar13;
              uStack_70 = puVar13[1];
              local_68 = puVar13[2];
              uStack_60 = puVar13[3];
              local_58 = *(undefined4 *)(puVar13 + 4);
              uStack_54 = *(undefined4 *)((long)puVar13 + 0x24);
              uStack_50 = *(undefined4 *)(puVar13 + 5);
              uStack_4c = *(undefined4 *)((long)puVar13 + 0x2c);
              local_48 = *(undefined4 *)(puVar13 + 6);
              uStack_44 = *(undefined4 *)((long)puVar13 + 0x34);
              uStack_40 = *(undefined4 *)(puVar13 + 7);
              uStack_3c = *(undefined4 *)((long)puVar13 + 0x3c);
              al_color_name("black");
              auVar31 = al_color_name("white");
              uVar9 = al_get_current_display();
              al_get_display_width(uVar9);
              al_get_display_height(uVar9);
              al_identity_transform(local_108);
              al_translate_transform_3d(0,local_108);
              tan(ex.camera.vertical_field_of_view * 0.5);
              al_perspective_transform(local_108);
              al_use_projection_transform(local_108);
              al_clear_to_color();
              al_set_render_state(0x12,1);
              al_clear_depth_buffer();
              ex.n = 0;
              auVar32 = al_color_name("yellow");
              uVar26 = auVar32._0_4_;
              fVar24 = auVar32._4_4_;
              uVar28 = auVar32._8_4_;
              uVar27 = auVar32._12_4_;
              auVar32 = al_color_name("green");
              iVar14 = 0;
              do {
                dVar20 = (double)(iVar14 + -10);
                iVar17 = -10;
                do {
                  local_108._4_4_ = fVar24;
                  local_108._0_4_ = uVar26;
                  local_108._12_4_ = uVar27;
                  local_108._8_4_ = uVar28;
                  dVar21 = 0.2;
                  if ((iVar14 + iVar17 + 10U & 1) != 0) {
                    dVar21 = 0.1;
                    local_108._0_16_ = auVar32;
                  }
                  AVar33.b = (float)uVar26;
                  AVar33.r = (float)(int)in_stack_fffffffffffffdc0;
                  AVar33.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
                  AVar33.a = fVar24;
                  AVar34.g = (float)uVar27;
                  AVar34.r = (float)uVar28;
                  AVar34.b = (float)SUB84(dVar20,0);
                  AVar34.a = (float)((ulong)dVar20 >> 0x20);
                  add_quad((double)iVar17,dVar21,dVar20,0.0,0.0,1.0,0.0,0.0,0.0,1.0,0.0,
                           (double)local_108._0_8_,(double)local_108._8_8_,(double)local_108._0_8_,
                           (double)local_108._8_8_,AVar33,AVar34);
                  fVar30 = ex.camera.position.z;
                  fVar18 = ex.camera.position.y;
                  fVar25 = ex.camera.position.x;
                  iVar17 = iVar17 + 1;
                } while (iVar17 != 10);
                iVar14 = iVar14 + 1;
              } while (iVar14 != 0x14);
              AVar33 = (ALLEGRO_COLOR)al_color_name("black");
              local_108._0_16_ = (undefined1  [16])AVar33;
              AVar33 = (ALLEGRO_COLOR)al_color_name("blue");
              AVar34 = (ALLEGRO_COLOR)al_color_name("white");
              if (ex.skybox == (ALLEGRO_BITMAP *)0x0) {
                dVar21 = 0.0;
                dVar20 = 0.0;
              }
              else {
                iVar14 = al_get_bitmap_width();
                dVar21 = (double)iVar14 * 0.25;
                iVar14 = al_get_bitmap_height(ex.skybox);
                dVar20 = (double)iVar14 / 3.0;
                AVar33 = AVar34;
                local_108._0_16_ = (undefined1  [16])AVar34;
              }
              dStack_1c0 = AVar33._8_8_;
              local_1c8 = AVar33._0_8_;
              x = (double)(fVar25 + -50.0);
              dVar23 = (double)(fVar18 + -50.0);
              dVar36 = (double)(fVar30 + -50.0);
              dVar22 = dVar20 + dVar20;
              dVar1 = -dVar21;
              dVar2 = -dVar20;
              c1.b = (float)SUB84(dVar23,0);
              c1.r = (float)(int)in_stack_fffffffffffffdc0;
              c1.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
              c1.a = (float)((ulong)dVar23 >> 0x20);
              c2.g = (float)uVar27;
              c2.r = (float)uVar28;
              c2.b = (float)SUB84(dVar21,0);
              c2.a = (float)((ulong)dVar21 >> 0x20);
              add_quad(x,dVar23,dVar36,dVar21 * 4.0,dVar22,100.0,0.0,dVar1,100.0,0.0,dVar2,
                       (double)local_108._0_8_,(double)local_108._8_8_,local_1c8,dStack_1c0,c1,c2);
              dVar19 = (double)(fVar30 + 50.0);
              c1_00.b = (float)SUB84(dVar23,0);
              c1_00.r = (float)(int)in_stack_fffffffffffffdc0;
              c1_00.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
              c1_00.a = (float)((ulong)dVar23 >> 0x20);
              c2_00.g = (float)uVar27;
              c2_00.r = (float)uVar28;
              c2_00.b = (float)SUB84(dVar21,0);
              c2_00.a = (float)((ulong)dVar21 >> 0x20);
              add_quad(x,dVar23,dVar19,dVar21,dVar22,100.0,0.0,dVar21,100.0,0.0,dVar2,
                       (double)local_108._0_8_,(double)local_108._8_8_,local_1c8,dStack_1c0,c1_00,
                       c2_00);
              c1_01.b = (float)SUB84(dVar23,0);
              c1_01.r = (float)(int)in_stack_fffffffffffffdc0;
              c1_01.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
              c1_01.a = (float)((ulong)dVar23 >> 0x20);
              c2_01.g = (float)uVar27;
              c2_01.r = (float)uVar28;
              c2_01.b = (float)SUB84(dVar21,0);
              c2_01.a = (float)((ulong)dVar21 >> 0x20);
              add_quad(x,dVar23,dVar36,0.0,dVar22,0.0,100.0,dVar21,100.0,0.0,dVar2,
                       (double)local_108._0_8_,(double)local_108._8_8_,local_1c8,dStack_1c0,c1_01,
                       c2_01);
              x_00 = (double)(fVar25 + 50.0);
              c1_02.b = (float)SUB84(dVar23,0);
              c1_02.r = (float)(int)in_stack_fffffffffffffdc0;
              c1_02.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
              c1_02.a = (float)((ulong)dVar23 >> 0x20);
              c2_02.g = (float)uVar27;
              c2_02.r = (float)uVar28;
              c2_02.b = (float)SUB84(dVar21,0);
              c2_02.a = (float)((ulong)dVar21 >> 0x20);
              add_quad(x_00,dVar23,dVar36,dVar21 * 3.0,dVar22,0.0,100.0,dVar1,100.0,0.0,dVar2,
                       (double)local_108._0_8_,(double)local_108._8_8_,local_1c8,dStack_1c0,c1_02,
                       c2_02);
              y = (double)(fVar18 + 50.0);
              add_vertex(x,y,dVar36,dVar21,0.0,AVar33);
              dVar23 = dVar21 + dVar21;
              add_vertex(x_00,y,dVar36,dVar23,0.0,AVar33);
              x_01 = (double)fVar25;
              dVar1 = (double)fVar30;
              dVar2 = dVar21 * 1.5;
              dVar22 = dVar20 * 0.5;
              add_vertex(x_01,y,dVar1,dVar2,dVar22,AVar34);
              add_vertex(x_00,y,dVar36,dVar23,0.0,AVar33);
              add_vertex(x_00,y,dVar19,dVar23,dVar20,AVar33);
              add_vertex(x_01,y,dVar1,dVar2,dVar22,AVar34);
              add_vertex(x_00,y,dVar19,dVar23,dVar20,AVar33);
              add_vertex(x,y,dVar19,dVar21,dVar20,AVar33);
              add_vertex(x_01,y,dVar1,dVar2,dVar22,AVar34);
              add_vertex(x,y,dVar19,dVar21,dVar20,AVar33);
              add_vertex(x,y,dVar36,dVar21,0.0,AVar33);
              add_vertex(x_01,y,dVar1,dVar2,dVar22,AVar34);
              uVar35 = (ulong)(uint)ex.camera.yaxis.z;
              al_build_camera_transform(local_108);
              al_use_transform(local_108);
              al_draw_prim(ex.v,0,ex.skybox,0,ex.n,3,uVar35);
              al_identity_transform(local_108);
              al_use_transform(local_108);
              al_use_projection_transform(&local_78);
              al_set_render_state(0x12,0);
              iVar14 = al_get_font_line_height(ex.font);
              pCVar15 = (Camera *)ex.font;
              al_draw_textf(ex.font,0,
                            "look: %+3.1f/%+3.1f/%+3.1f (change with left mouse button and drag)");
              dVar20 = (double)(ex.camera.zaxis.z * ex.camera.zaxis.z +
                               ex.camera.zaxis.x * ex.camera.zaxis.x + 0.0);
              fVar24 = ex.camera.zaxis.x;
              fVar25 = ex.camera.zaxis.z;
              if (dVar20 < 0.0) {
                dVar20 = sqrt(dVar20);
              }
              else {
                dVar20 = SQRT(dVar20);
              }
              fVar24 = -fVar24;
              fVar25 = -fVar25;
              if ((dVar20 != 0.0) || (NAN(dVar20))) {
                fVar18 = (float)(1.0 / dVar20);
                fVar25 = fVar25 * fVar18;
                fVar24 = fVar18 * fVar24;
                fVar18 = fVar18 * 0.0;
              }
              else {
                fVar18 = 0.0;
              }
              asin((double)(fVar25 * ex.camera.yaxis.z +
                           fVar24 * ex.camera.yaxis.x + fVar18 * ex.camera.yaxis.y));
              atan2((double)ex.camera.zaxis.x,(double)ex.camera.zaxis.z);
              get_roll(pCVar15);
              bVar3 = false;
              al_draw_textf(ex.font,0,"pitch: %+4.0f yaw: %+4.0f roll: %+4.0f");
              al_draw_textf(ex.font,0,"vertical field of view: %3.1f (change with Z/X)");
              al_draw_textf(ex.font,0,"move with WASD or cursor");
              al_draw_textf(auVar31._0_8_,auVar31._8_8_,0,(float)(iVar14 << 2),ex.font,0,
                            "control style: %s (space to change)");
              al_flip_display();
            }
          }
          else {
            bVar3 = false;
          }
        }
        else {
          if (local_c0[0] < 0x29) {
            if (local_c0[0] == 0x16) {
              ex.button[local_80] = 0;
            }
            else if (local_c0[0] == 0x1e) {
              uVar26 = 0xbff00000;
              if (ex.key[0x52] == 0 && ex.key[1] == 0) {
                uVar26 = 0;
              }
              uVar28 = 0xbff00000;
              if (ex.key[0x55] == 0 && ex.key[0x13] == 0) {
                uVar28 = 0;
              }
              uVar27 = 0x3ff00000;
              if (ex.key[0x53] == 0 && ex.key[4] == 0) {
                uVar27 = uVar26;
              }
              uVar26 = 0;
              uVar29 = 0x3ff00000;
              if (ex.key[0x54] == 0 && ex.key[0x17] == 0) {
                uVar29 = uVar28;
              }
              uVar28 = 0;
              if (ex.key[0x1a] != 0) {
                dVar20 = ex.camera.vertical_field_of_view + -0.01;
                ex.camera.vertical_field_of_view = 0.3490658503988659;
                if (0.3490658503988659 <= dVar20) {
                  ex.camera.vertical_field_of_view = dVar20;
                }
              }
              if (ex.key[0x18] != 0) {
                dVar20 = ex.camera.vertical_field_of_view + 0.01;
                ex.camera.vertical_field_of_view = 2.0943951023931953;
                if (dVar20 <= 2.0943951023931953) {
                  ex.camera.vertical_field_of_view = dVar20;
                }
              }
              if (ex.controls == 0) {
                if (2.0 < ex.camera.position.y) {
                  ex.camera.position.y = ex.camera.position.y + -0.1;
                }
                if (ex.camera.position.y < 2.0) {
                  ex.camera.position.y = 2.0;
                }
              }
              if ((ex.controls & 0xfffffffdU) == 0) {
                dVar20 = get_roll(pCVar15);
                axis.y = ex.camera.zaxis.y;
                axis.x = ex.camera.zaxis.x;
                axis.z = ex.camera.zaxis.z;
                camera_rotate_around_axis(pCVar15,axis,dVar20 / 60.0);
              }
              dVar20 = (double)CONCAT44(uVar27,uVar26) * (double)CONCAT44(uVar27,uVar26) +
                       (double)CONCAT44(uVar29,uVar28) * (double)CONCAT44(uVar29,uVar28);
              if (dVar20 < 0.0) {
                dVar20 = sqrt(dVar20);
              }
              else {
                dVar20 = SQRT(dVar20);
              }
              dVar21 = ex.movement_speed;
              fVar25 = ex.camera.zaxis.z;
              fVar24 = ex.camera.zaxis.x;
              if (0.0 < dVar20) {
                dVar36 = (double)CONCAT44(uVar27,uVar26) / dVar20;
                dVar20 = (double)CONCAT44(uVar29,uVar28) / dVar20;
                if (ex.controls == 0) {
                  dVar19 = (double)(ex.camera.zaxis.z * ex.camera.zaxis.z +
                                   ex.camera.zaxis.x * ex.camera.zaxis.x + 0.0);
                  if (dVar19 < 0.0) {
                    dVar19 = sqrt(dVar19);
                  }
                  else {
                    dVar19 = SQRT(dVar19);
                  }
                  fVar30 = ex.camera.xaxis.z;
                  fVar18 = ex.camera.xaxis.x;
                  fVar24 = -fVar24;
                  fVar25 = -fVar25;
                  if ((dVar19 != 0.0) || (NAN(dVar19))) {
                    fVar25 = fVar25 * (float)(1.0 / dVar19);
                    fVar24 = (float)(1.0 / dVar19) * fVar24;
                  }
                  dVar19 = (double)(ex.camera.xaxis.z * ex.camera.xaxis.z +
                                   ex.camera.xaxis.x * ex.camera.xaxis.x + 0.0);
                  if (dVar19 < 0.0) {
                    dVar19 = sqrt(dVar19);
                  }
                  else {
                    dVar19 = SQRT(dVar19);
                  }
                  if ((dVar19 != 0.0) || (NAN(dVar19))) {
                    fVar18 = fVar18 * (float)(1.0 / dVar19);
                    fVar30 = fVar30 * (float)(1.0 / dVar19);
                  }
                  dVar19 = dVar36 * dVar21;
                  dVar21 = dVar21 * dVar20;
                  ex.camera.position.x =
                       (float)((double)ex.camera.position.x +
                              (double)fVar24 * dVar21 + (double)fVar18 * dVar19);
                  ex.camera.position.z =
                       (float)((double)ex.camera.position.z +
                              (double)fVar25 * dVar21 + (double)fVar30 * dVar19);
                }
                if (ex.controls - 1U < 2) {
                  fVar24 = (float)(dVar36 * ex.movement_speed);
                  fVar25 = (float)(dVar20 * ex.movement_speed);
                  ex.camera.position.x =
                       (ex.camera.position.x + fVar24 * ex.camera.xaxis.x) -
                       fVar25 * ex.camera.zaxis.x;
                  ex.camera.position.y =
                       (ex.camera.position.y + fVar24 * ex.camera.xaxis.y) -
                       fVar25 * ex.camera.zaxis.y;
                  ex.camera.position.z =
                       (ex.camera.xaxis.z * fVar24 + ex.camera.position.z) -
                       fVar25 * ex.camera.zaxis.z;
                }
              }
              if (ex.button[1] != 0) {
                if ((ex.controls & 0xfffffffdU) == 0) {
                  axis_00.y = ex.camera.xaxis.y;
                  axis_00.x = ex.camera.xaxis.x;
                  axis_00.z = ex.camera.xaxis.z;
                  camera_rotate_around_axis
                            (pCVar15,axis_00,(double)ex.mouse_dy * -ex.mouse_look_speed);
                  camera_rotate_around_axis
                            (pCVar15,(Vector)ZEXT812(0x3f80000000000000),
                             (double)ex.mouse_dx * -ex.mouse_look_speed);
                }
                if (ex.controls == 1) {
                  axis_01.y = ex.camera.xaxis.y;
                  axis_01.x = ex.camera.xaxis.x;
                  axis_01.z = ex.camera.xaxis.z;
                  camera_rotate_around_axis
                            (pCVar15,axis_01,(double)ex.mouse_dy * -ex.mouse_look_speed);
                  axis_02.y = ex.camera.zaxis.y;
                  axis_02.x = ex.camera.zaxis.x;
                  axis_02.z = ex.camera.zaxis.z;
                  camera_rotate_around_axis
                            (pCVar15,axis_02,(double)ex.mouse_dx * -ex.mouse_look_speed);
                }
              }
              lVar12 = -0xe3;
              do {
                if (*(int *)((long)ex.controls_names + lVar12 * 4 + -0x10) == 0) {
                  ex.keystate[lVar12] = 0;
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 != 0);
              ex.mouse_dx = 0;
              ex.mouse_dy = 0;
              bVar3 = true;
            }
            goto LAB_00102e8f;
          }
          if (local_c0[0] != 0x2a) {
            if (local_c0[0] == 0x29) {
              al_acknowledge_resize(lVar8);
            }
            goto LAB_00102e8f;
          }
LAB_00102a50:
          bVar4 = false;
        }
        if (!bVar4) {
          return 0;
        }
      } while( true );
    }
    pcVar16 = "Error creating display\n";
  }
  abort_example(pcVar16);
  fVar25 = ex.camera.xaxis.z;
  fVar24 = ex.camera.xaxis.x;
  dVar20 = (double)(ex.camera.xaxis.z * ex.camera.xaxis.z +
                   ex.camera.xaxis.x * ex.camera.xaxis.x + 0.0);
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  if ((dVar20 != 0.0) || (NAN(dVar20))) {
    fVar30 = (float)(1.0 / dVar20);
    fVar24 = fVar24 * fVar30;
    fVar18 = fVar30 * 0.0;
    fVar25 = fVar25 * fVar30;
  }
  else {
    fVar18 = 0.0;
  }
  asin((double)(fVar25 * ex.camera.yaxis.z + fVar24 * ex.camera.yaxis.x + fVar18 * ex.camera.yaxis.y
               ));
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int redraw = 0;
   char const *skybox_name = NULL;

   if (argc > 1) {
      skybox_name = argv[1];
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_font_addon();
   al_init_primitives_addon();
   init_platform_specific();
   al_install_keyboard();
   al_install_mouse();

   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   display = al_create_display(640, 360);
   if (!display) {
      abort_example("Error creating display\n");
   }

   if (skybox_name) {
      al_init_image_addon();
      ex.skybox = al_load_bitmap(skybox_name);
      if (ex.skybox) {
         printf("Loaded skybox %s: %d x %d\n", skybox_name,
            al_get_bitmap_width(ex.skybox),
            al_get_bitmap_height(ex.skybox));
      }
      else {
         printf("Failed loading skybox %s\n", skybox_name);
      }
   }

   timer = al_create_timer(1.0 / 60);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   setup_scene();

   al_start_timer(timer);
   while (true) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
         break;
      else if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(display);
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
            ex.controls++;
            ex.controls %= 3;
         }
         ex.key[event.keyboard.keycode] = 1;
         ex.keystate[event.keyboard.keycode] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_UP) {
         /* In case a key gets pressed and immediately released, we will still
          * have set ex.key so it is not lost.
          */
         ex.keystate[event.keyboard.keycode] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         int i;
         handle_input();
         redraw = 1;

         /* Reset keyboard state for keys not held down anymore. */
         for (i = 0; i < ALLEGRO_KEY_MAX; i++) {
            if (ex.keystate[i] == 0)
               ex.key[i] = 0;
         }
         ex.mouse_dx = 0;
         ex.mouse_dy = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         ex.button[event.mouse.button] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_UP) {
         ex.button[event.mouse.button] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_AXES) {
         ex.mouse_dx += event.mouse.dx;
         ex.mouse_dy += event.mouse.dy;
      }

      if (redraw  && al_is_event_queue_empty(queue)) {
         draw_scene();

         al_flip_display();
         redraw = 0;
      }
   }

   return 0;
}